

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O1

int __thiscall
cmCPackIFWPackage::ConfigureFromComponent(cmCPackIFWPackage *this,cmCPackComponent *component)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  long lVar1;
  cmCPackIFWGenerator *pcVar2;
  cmCPackLog *this_01;
  undefined8 msg;
  cmCPackComponent *pcVar3;
  int iVar4;
  long *plVar5;
  char *pcVar6;
  mapped_type *__v;
  size_t sVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  ostream *poVar11;
  size_type *psVar12;
  long *plVar13;
  pointer pcVar14;
  iterator dit;
  pointer __k;
  string *dependence;
  char *pcVar15;
  string prefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deps;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_208;
  long local_1f8;
  long lStack_1f0;
  undefined1 local_1e8 [32];
  cmCPackComponent *local_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [3];
  ios_base local_150 [264];
  cmCPackIFWPackage *local_48;
  _Rb_tree<cmCPackIFWPackage::DependenceStruct*,cmCPackIFWPackage::DependenceStruct*,std::_Identity<cmCPackIFWPackage::DependenceStruct*>,std::less<cmCPackIFWPackage::DependenceStruct*>,std::allocator<cmCPackIFWPackage::DependenceStruct*>>
  *local_40;
  mapped_type *local_38;
  
  if (component == (cmCPackComponent *)0x0) {
    iVar4 = 0;
  }
  else {
    DefaultConfiguration(this);
    cmsys::SystemTools::UpperCase((string *)local_1e8,&component->Name);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_1e8,0,(char *)0x0,0x4ff150);
    pcVar14 = local_1c0 + 0x10;
    psVar12 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar12) {
      local_1c0._16_8_ = *psVar12;
      local_1c0._24_8_ = plVar5[3];
      local_1c0._0_8_ = pcVar14;
    }
    else {
      local_1c0._16_8_ = *psVar12;
      local_1c0._0_8_ = (size_type *)*plVar5;
    }
    local_1c0._8_8_ = plVar5[1];
    *plVar5 = (long)psVar12;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append(local_1c0);
    local_208 = &local_1f8;
    plVar13 = plVar5 + 2;
    if ((long *)*plVar5 == plVar13) {
      local_1f8 = *plVar13;
      lStack_1f0 = plVar5[3];
    }
    else {
      local_1f8 = *plVar13;
      local_208 = (long *)*plVar5;
    }
    lVar1 = plVar5[1];
    *plVar5 = (long)plVar13;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((pointer)local_1c0._0_8_ != pcVar14) {
      operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
    }
    if ((string *)local_1e8._0_8_ != (string *)(local_1e8 + 0x10)) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    std::__cxx11::string::_M_assign((string *)this);
    std::__cxx11::string::_M_assign((string *)&this->Description);
    local_1c8 = component;
    local_1c0._0_8_ = pcVar14;
    std::__cxx11::string::_M_construct<char*>((string *)local_1c0,local_208,(long)local_208 + lVar1)
    ;
    std::__cxx11::string::append(local_1c0);
    if (this->Generator == (cmCPackIFWGenerator *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = cmCPackGenerator::GetOption
                         (&this->Generator->super_cmCPackGenerator,(string *)local_1c0);
    }
    pcVar15 = (char *)0x0;
    if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
      pcVar15 = pcVar6;
    }
    if ((pointer)local_1c0._0_8_ != pcVar14) {
      operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
    }
    if (pcVar15 == (char *)0x0) {
      local_1c0._0_8_ = pcVar14;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c0,"CPACK_PACKAGE_VERSION","");
      if (this->Generator == (cmCPackIFWGenerator *)0x0) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = cmCPackGenerator::GetOption
                           (&this->Generator->super_cmCPackGenerator,(string *)local_1c0);
      }
      pcVar15 = (char *)0x0;
      if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
        pcVar15 = pcVar6;
      }
      if ((pointer)local_1c0._0_8_ != pcVar14) {
        operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
      }
      pcVar6 = (char *)(this->Version)._M_string_length;
      if (pcVar15 == (char *)0x0) {
        pcVar15 = "1.0.0";
      }
      else {
        strlen(pcVar15);
      }
      std::__cxx11::string::_M_replace((ulong)&this->Version,0,pcVar6,(ulong)pcVar15);
    }
    else {
      pcVar6 = (char *)(this->Version)._M_string_length;
      strlen(pcVar15);
      std::__cxx11::string::_M_replace((ulong)&this->Version,0,pcVar6,(ulong)pcVar15);
    }
    local_1c0._0_8_ = local_1c0 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)local_1c0,local_208,(long)local_208 + lVar1)
    ;
    std::__cxx11::string::append(local_1c0);
    if (this->Generator == (cmCPackIFWGenerator *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = cmCPackGenerator::GetOption
                         (&this->Generator->super_cmCPackGenerator,(string *)local_1c0);
    }
    pcVar15 = (char *)0x0;
    if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
      pcVar15 = pcVar6;
    }
    if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
      operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
    }
    if (pcVar15 != (char *)0x0) {
      pcVar6 = (char *)(this->Script)._M_string_length;
      strlen(pcVar15);
      std::__cxx11::string::_M_replace((ulong)&this->Script,0,pcVar6,(ulong)pcVar15);
    }
    __k = (local_1c8->Dependencies).
          super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
          super__Vector_impl_data._M_start;
    if ((__k != (local_1c8->Dependencies).
                super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
                super__Vector_impl_data._M_finish) &&
       (__k != (local_1c8->Dependencies).
               super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
               super__Vector_impl_data._M_finish)) {
      do {
        __v = std::
              map<cmCPackComponent_*,_cmCPackIFWPackage_*,_std::less<cmCPackComponent_*>,_std::allocator<std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>_>_>
              ::operator[](&this->Generator->ComponentPackages,__k);
        std::
        _Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
        ::_M_insert_unique<cmCPackIFWPackage*const&>
                  ((_Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
                    *)&this->Dependencies,__v);
        __k = __k + 1;
      } while (__k != (local_1c8->Dependencies).
                      super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    }
    pcVar14 = local_1c0 + 0x10;
    local_1c0._0_8_ = pcVar14;
    std::__cxx11::string::_M_construct<char*>((string *)local_1c0,local_208,(long)local_208 + lVar1)
    ;
    std::__cxx11::string::append(local_1c0);
    if (this->Generator == (cmCPackIFWGenerator *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = cmCPackGenerator::GetOption
                         (&this->Generator->super_cmCPackGenerator,(string *)local_1c0);
    }
    pcVar15 = (char *)0x0;
    if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
      pcVar15 = pcVar6;
    }
    if ((pointer)local_1c0._0_8_ != pcVar14) {
      operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
    }
    if (pcVar15 != (char *)0x0) {
      local_1e8._0_8_ = (string *)0x0;
      local_1e8._8_8_ = (string *)0x0;
      local_1e8._16_8_ = 0;
      local_1c0._0_8_ = pcVar14;
      sVar7 = strlen(pcVar15);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,pcVar15,pcVar15 + sVar7);
      cmSystemTools::ExpandListArgument
                ((string *)local_1c0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1e8,false);
      if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
        operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
      }
      if (local_1e8._0_8_ != local_1e8._8_8_) {
        local_40 = (_Rb_tree<cmCPackIFWPackage::DependenceStruct*,cmCPackIFWPackage::DependenceStruct*,std::_Identity<cmCPackIFWPackage::DependenceStruct*>,std::less<cmCPackIFWPackage::DependenceStruct*>,std::allocator<cmCPackIFWPackage::DependenceStruct*>>
                    *)&this->AlienDependencies;
        dependence = (string *)local_1e8._0_8_;
        local_48 = this;
        do {
          DependenceStruct::DependenceStruct((DependenceStruct *)local_1c0,dependence);
          pcVar2 = this->Generator;
          cVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
                  ::find(&(pcVar2->Packages)._M_t,(key_type *)local_1c0);
          if ((_Rb_tree_header *)cVar8._M_node ==
              &(pcVar2->Packages)._M_t._M_impl.super__Rb_tree_header) {
            pcVar2 = this->Generator;
            cVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
                    ::find(&(pcVar2->DependentPackages)._M_t,(key_type *)local_1c0);
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
                      ::operator[](&this->Generator->DependentPackages,(key_type *)local_1c0);
            if ((_Rb_tree_header *)cVar9._M_node ==
                &(pcVar2->DependentPackages)._M_t._M_impl.super__Rb_tree_header) {
              std::__cxx11::string::_M_assign((string *)pmVar10);
              (pmVar10->Compare).Type = local_1a0;
              std::__cxx11::string::_M_assign((string *)&(pmVar10->Compare).Value);
            }
            local_38 = pmVar10;
            std::
            _Rb_tree<cmCPackIFWPackage::DependenceStruct*,cmCPackIFWPackage::DependenceStruct*,std::_Identity<cmCPackIFWPackage::DependenceStruct*>,std::less<cmCPackIFWPackage::DependenceStruct*>,std::allocator<cmCPackIFWPackage::DependenceStruct*>>
            ::_M_insert_unique<cmCPackIFWPackage::DependenceStruct*>(local_40,&local_38);
            this = local_48;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_p != local_188) {
            operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
            operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
          }
          dependence = dependence + 1;
        } while (dependence != (string *)local_1e8._8_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1e8);
    }
    pcVar14 = local_1c0 + 0x10;
    local_1c0._0_8_ = pcVar14;
    std::__cxx11::string::_M_construct<char*>((string *)local_1c0,local_208,(long)local_208 + lVar1)
    ;
    std::__cxx11::string::append(local_1c0);
    if (this->Generator == (cmCPackIFWGenerator *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = cmCPackGenerator::GetOption
                         (&this->Generator->super_cmCPackGenerator,(string *)local_1c0);
    }
    pcVar15 = (char *)0x0;
    if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
      pcVar15 = pcVar6;
    }
    if ((pointer)local_1c0._0_8_ != pcVar14) {
      operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
    }
    if (pcVar15 != (char *)0x0) {
      this_00 = &this->Licenses;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(this_00,(this->Licenses).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
      local_1c0._0_8_ = pcVar14;
      sVar7 = strlen(pcVar15);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,pcVar15,pcVar15 + sVar7);
      cmSystemTools::ExpandListArgument((string *)local_1c0,this_00,false);
      if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
        operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
      }
      if ((*(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
           *(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start & 0x20U) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1c0,(char *)local_208,lVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"LICENSES",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11," should contain pairs of <display_name> and <file_path>.",0x38);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        if (this->Generator != (cmCPackIFWGenerator *)0x0) {
          this_01 = (this->Generator->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          msg = local_1e8._0_8_;
          sVar7 = strlen((char *)local_1e8._0_8_);
          cmCPackLog::Log(this_01,8,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                          ,0x134,(char *)msg,sVar7);
          if ((string *)local_1e8._0_8_ != (string *)(local_1e8 + 0x10)) {
            operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
          }
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
        std::ios_base::~ios_base(local_150);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end(this_00,(this_00->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
      }
    }
    local_1c0._0_8_ = local_1c0 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)local_1c0,local_208,(long)local_208 + lVar1)
    ;
    std::__cxx11::string::append(local_1c0);
    if (this->Generator == (cmCPackIFWGenerator *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = cmCPackGenerator::GetOption
                         (&this->Generator->super_cmCPackGenerator,(string *)local_1c0);
    }
    pcVar15 = (char *)0x0;
    if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
      pcVar15 = pcVar6;
    }
    if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
      operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
    }
    if (pcVar15 != (char *)0x0) {
      pcVar6 = (char *)(this->SortingPriority)._M_string_length;
      strlen(pcVar15);
      std::__cxx11::string::_M_replace((ulong)&this->SortingPriority,0,pcVar6,(ulong)pcVar15);
    }
    pcVar3 = local_1c8;
    pcVar15 = "false";
    pcVar6 = "false";
    if ((local_1c8->field_0x48 & 4) == 0) {
      pcVar6 = "true";
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->Default,0,(char *)(this->Default)._M_string_length,(ulong)pcVar6);
    pcVar6 = "";
    if ((pcVar3->field_0x48 & 2) != 0) {
      pcVar6 = "true";
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->Virtual,0,(char *)(this->Virtual)._M_string_length,(ulong)pcVar6);
    if ((pcVar3->field_0x48 & 1) != 0) {
      pcVar15 = "true";
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->ForcedInstallation,0,
               (char *)(this->ForcedInstallation)._M_string_length,(ulong)pcVar15);
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromComponent(cmCPackComponent *component)
{
  if(!component) return 0;

  // Restore defaul configuration
  DefaultConfiguration();

  std::string prefix = "CPACK_IFW_COMPONENT_"
    + cmsys::SystemTools::UpperCase(component->Name)
    + "_";

  // Display name
  DisplayName = component->DisplayName;

  // Description
  Description = component->Description;

  // Version
  if(const char* optVERSION = GetOption(prefix + "VERSION"))
    {
    Version = optVERSION;
    }
  else if(const char* optPACKAGE_VERSION =
          GetOption("CPACK_PACKAGE_VERSION"))
    {
    Version = optPACKAGE_VERSION;
    }
  else
    {
    Version = "1.0.0";
    }

  // Script
  if (const char* option = GetOption(prefix + "SCRIPT"))
    {
    Script = option;
    }

  // CMake dependencies
  if (!component->Dependencies.empty())
    {
    std::vector<cmCPackComponent*>::iterator dit;
    for(dit = component->Dependencies.begin();
        dit != component->Dependencies.end();
        ++dit)
      {
      Dependencies.insert(Generator->ComponentPackages[*dit]);
      }
    }

  // QtIFW dependencies
  if(const char* option = this->GetOption(prefix + "DEPENDS"))
    {
    std::vector<std::string> deps;
    cmSystemTools::ExpandListArgument(option,
                                      deps);
    for(std::vector<std::string>::iterator
          dit = deps.begin(); dit != deps.end(); ++dit)
      {
      DependenceStruct dep(*dit);
      if (!Generator->Packages.count(dep.Name))
        {
        bool hasDep = Generator->DependentPackages.count(dep.Name) > 0;
        DependenceStruct &depRef =
          Generator->DependentPackages[dep.Name];
        if(!hasDep)
          {
          depRef = dep;
          }
        AlienDependencies.insert(&depRef);
        }
      }
    }

  // Licenses
  if (const char* option = this->GetOption(prefix + "LICENSES"))
    {
    Licenses.clear();
    cmSystemTools::ExpandListArgument( option, Licenses );
    if ( Licenses.size() % 2 != 0 )
      {
      cmCPackLogger(cmCPackLog::LOG_WARNING, prefix << "LICENSES"
        << " should contain pairs of <display_name> and <file_path>."
        << std::endl);
      Licenses.clear();
      }
    }

  // Priority
  if(const char* option = this->GetOption(prefix + "PRIORITY"))
    {
    SortingPriority = option;
    }

  // Default
  Default = component->IsDisabledByDefault ? "false" : "true";

  // Virtual
  Virtual = component->IsHidden ? "true" : "";

  // ForcedInstallation
  ForcedInstallation = component->IsRequired ? "true" : "false";

  return 1;
}